

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QMdiArea::closeActiveSubWindow(QMdiArea *this)

{
  long lVar1;
  int in_ESI;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (((*(long *)(lVar1 + 0x388) != 0) && (*(int *)(*(long *)(lVar1 + 0x388) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x390) != 0)) {
    QWidget::close(*(QWidget **)(lVar1 + 0x390),in_ESI);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }